

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_compileoption_used(char *zOptName)

{
  char *zRight;
  int iVar1;
  uint N;
  char *z;
  long lVar2;
  
  iVar1 = sqlite3_strnicmp(zOptName,"SQLITE_",7);
  z = zOptName + 7;
  if (iVar1 != 0) {
    z = zOptName;
  }
  N = sqlite3Strlen30(z);
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x170) {
      return 0;
    }
    zRight = *(char **)((long)sqlite3azCompileOpt + lVar2);
    iVar1 = sqlite3_strnicmp(z,zRight,N);
    if ((iVar1 == 0) && ((""[(byte)zRight[N]] & 0x46) == 0)) break;
    lVar2 = lVar2 + 8;
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_compileoption_used(const char *zOptName){
  int i, n;
  int nOpt;
  const char **azCompileOpt;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zOptName==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  azCompileOpt = sqlite3CompileOptions(&nOpt);

  if( sqlite3StrNICmp(zOptName, "SQLITE_", 7)==0 ) zOptName += 7;
  n = sqlite3Strlen30(zOptName);

  /* Since nOpt is normally in single digits, a linear search is
  ** adequate. No need for a binary search. */
  for(i=0; i<nOpt; i++){
    if( sqlite3StrNICmp(zOptName, azCompileOpt[i], n)==0
     && sqlite3IsIdChar((unsigned char)azCompileOpt[i][n])==0
    ){
      return 1;
    }
  }
  return 0;
}